

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

_Bool multi_handle_timeout(Curl_easy *data,curltime *now,_Bool *stream_error,CURLcode *result)

{
  CURLMstate CVar1;
  undefined4 uVar2;
  curl_off_t cVar3;
  long lVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  ulong uVar11;
  timediff_t tVar12;
  timediff_t tVar13;
  char *fmt;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  
  CVar1 = data->mstate;
  tVar12 = Curl_timeleft(data,now,CVar1 < MSTATE_DO);
  if (-1 < tVar12) goto LAB_00146fcf;
  uVar11 = (ulong)(MSTATE_PROTOCONNECTING < CVar1);
  cVar3 = (data->progress).speeder[uVar11 * 2 + -6];
  uVar2 = (undefined4)(data->progress).speeder[uVar11 * 2 + -5];
  if (data->mstate == MSTATE_CONNECTING) {
    uVar7 = now->tv_sec;
    uVar8 = now->tv_usec;
    newer_00.tv_usec = uVar8;
    newer_00.tv_sec = uVar7;
    newer_00._12_4_ = 0;
    older_00.tv_usec = uVar2;
    older_00.tv_sec = cVar3;
    older_00._12_4_ = 0;
    tVar13 = Curl_timediff(newer_00,older_00);
    fmt = "Connection timed out after %ld milliseconds";
LAB_00146f3b:
    Curl_failf(data,fmt,tVar13);
  }
  else {
    if (data->mstate == MSTATE_RESOLVING) {
      uVar5 = now->tv_sec;
      uVar6 = now->tv_usec;
      newer.tv_usec = uVar6;
      newer.tv_sec = uVar5;
      newer._12_4_ = 0;
      older.tv_usec = uVar2;
      older.tv_sec = cVar3;
      older._12_4_ = 0;
      tVar13 = Curl_timediff(newer,older);
      fmt = "Resolving timed out after %ld milliseconds";
      goto LAB_00146f3b;
    }
    lVar4 = (data->req).size;
    uVar9 = now->tv_sec;
    uVar10 = now->tv_usec;
    newer_01.tv_usec = uVar10;
    newer_01.tv_sec = uVar9;
    newer_01._12_4_ = 0;
    older_01.tv_usec = uVar2;
    older_01.tv_sec = cVar3;
    older_01._12_4_ = 0;
    tVar13 = Curl_timediff(newer_01,older_01);
    cVar3 = (data->req).bytecount;
    if (lVar4 == -1) {
      Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",tVar13,
                 cVar3);
    }
    else {
      Curl_failf(data,
                 "Operation timed out after %ld milliseconds with %ld out of %ld bytes received",
                 tVar13,cVar3,(data->req).size);
    }
  }
  *result = CURLE_OPERATION_TIMEDOUT;
  if (data->conn != (connectdata *)0x0) {
    if (MSTATE_DO < data->mstate) {
      Curl_conncontrol(data->conn,2);
      *stream_error = true;
    }
    multi_done(data,*result,true);
  }
LAB_00146fcf:
  return SUB81((ulong)tVar12 >> 0x3f,0);
}

Assistant:

static bool multi_handle_timeout(struct Curl_easy *data,
                                 struct curltime *now,
                                 bool *stream_error,
                                 CURLcode *result)
{
  bool connect_timeout = data->mstate < MSTATE_DO;
  timediff_t timeout_ms = Curl_timeleft(data, now, connect_timeout);
  if(timeout_ms < 0) {
    /* Handle timed out */
    struct curltime since;
    if(connect_timeout)
      since = data->progress.t_startsingle;
    else
      since = data->progress.t_startop;
    if(data->mstate == MSTATE_RESOLVING)
      failf(data, "Resolving timed out after %" FMT_TIMEDIFF_T
            " milliseconds", Curl_timediff(*now, since));
    else if(data->mstate == MSTATE_CONNECTING)
      failf(data, "Connection timed out after %" FMT_TIMEDIFF_T
            " milliseconds", Curl_timediff(*now, since));
    else {
      struct SingleRequest *k = &data->req;
      if(k->size != -1) {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " out of %"
              FMT_OFF_T " bytes received",
              Curl_timediff(*now, since), k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " bytes received",
              Curl_timediff(*now, since), k->bytecount);
      }
    }
    *result = CURLE_OPERATION_TIMEDOUT;
    if(data->conn) {
      /* Force connection closed if the connection has indeed been used */
      if(data->mstate > MSTATE_DO) {
        streamclose(data->conn, "Disconnect due to timeout");
        *stream_error = TRUE;
      }
      (void)multi_done(data, *result, TRUE);
    }
    return TRUE;
  }

  return FALSE;
}